

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O2

void __thiscall Memory::Recycler::VerifyMarkRoots(Recycler *this)

{
  undefined4 *puVar1;
  EntryType *pEVar2;
  code *pcVar3;
  bool bVar4;
  GuestArenaAllocator *pGVar5;
  ArenaData **ppAVar6;
  SimpleHashEntry<void_*,_Memory::Recycler::PinRecord> **ppSVar7;
  uint i;
  ulong uVar8;
  undefined8 *in_FS_OFFSET;
  Iterator local_50;
  undefined1 local_40 [8];
  Iterator guestArenaIter;
  
  VerifyMark(this,this->transientPinnedObject);
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  for (uVar8 = 0; uVar8 < (this->pinnedObjectMap).size; uVar8 = uVar8 + 1) {
    ppSVar7 = (this->pinnedObjectMap).table + uVar8;
    while (pEVar2 = *ppSVar7, pEVar2 != (EntryType *)0x0) {
      if ((pEVar2->value).refCount == 0) {
        if (this->hasPendingUnpinnedObject == false) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar1 = 1;
          bVar4 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                             ,0x212d,"(this->hasPendingUnpinnedObject)",
                             "this->hasPendingUnpinnedObject");
          if (!bVar4) goto LAB_00293123;
          *puVar1 = 0;
        }
      }
      else {
        VerifyMark(this,pEVar2->key);
      }
      ppSVar7 = &pEVar2->next;
    }
  }
  local_40 = (undefined1  [8])&this->guestArenaList;
  guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)local_40;
LAB_00292fc4:
  if (guestArenaIter.list == (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar4) goto LAB_00293123;
    *puVar1 = 0;
  }
  guestArenaIter.list =
       ((guestArenaIter.list)->super_DListNodeBase<Memory::Recycler::GuestArenaAllocator>).next.list
  ;
  if ((undefined1  [8])guestArenaIter.list == local_40) {
    guestArenaIter.list = (DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount> *)0x0;
    local_50.list = &this->externalGuestArenaList;
    local_50.current = &(local_50.list)->super_DListNodeBase<Memory::ArenaData_*>;
    goto LAB_002930af;
  }
  pGVar5 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                     ((Iterator *)local_40);
  if (pGVar5->pendingDelete == true) {
    if (this->hasPendingDeleteGuestArena == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x213c,"(this->hasPendingDeleteGuestArena)",
                         "this->hasPendingDeleteGuestArena");
      if (!bVar4) goto LAB_00293123;
      *puVar1 = 0;
    }
  }
  else {
    pGVar5 = DListBase<Memory::Recycler::GuestArenaAllocator,_RealCount>::Iterator::Data
                       ((Iterator *)local_40);
    VerifyMarkArena(this,&(pGVar5->super_ArenaAllocator).
                          super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                          super_ArenaData);
  }
  goto LAB_00292fc4;
LAB_002930af:
  if ((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current ==
      (DListBase<Memory::ArenaData_*,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                       ,0x66,"(current != nullptr)","current != nullptr");
    if (!bVar4) {
LAB_00293123:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  local_50.current =
       (((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current)->
       super_DListNodeBase<Memory::ArenaData_*>).next.base;
  if ((DListBase<Memory::ArenaData_*,_RealCount> *)local_50.current == local_50.list) {
    return;
  }
  ppAVar6 = DListBase<Memory::ArenaData_*,_RealCount>::Iterator::Data(&local_50);
  VerifyMarkArena(this,*ppAVar6);
  goto LAB_002930af;
}

Assistant:

void
Recycler::VerifyMarkRoots()
{
    {
        this->VerifyMark(transientPinnedObject);
        pinnedObjectMap.Map([this](void * obj, PinRecord const &refCount)
        {
            if (refCount == 0)
            {
                Assert(this->hasPendingUnpinnedObject);
            }
            else
            {
                // Use the pinrecord as the source reference
                this->VerifyMark(obj);
            }
        });
    }

    DList<GuestArenaAllocator, HeapAllocator>::Iterator guestArenaIter(&guestArenaList);
    while (guestArenaIter.Next())
    {
        if (guestArenaIter.Data().pendingDelete)
        {
            Assert(this->hasPendingDeleteGuestArena);
        }
        else
        {
            VerifyMarkArena(&guestArenaIter.Data());
        }
    }

    DList<ArenaData *, HeapAllocator>::Iterator externalGuestArenaIter(&externalGuestArenaList);
    while (externalGuestArenaIter.Next())
    {
        VerifyMarkArena(externalGuestArenaIter.Data());
    }

    // We can't check external roots here
}